

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget.cpp
# Opt level: O0

void __thiscall QGraphicsWidget::setFont(QWindow *this,QFont *font)

{
  QGraphicsWidgetPrivate *this_00;
  QFont *in_RSI;
  QGraphicsWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QGraphicsWidgetPrivate *d;
  QFont resolvedFont;
  QFont naturalFont;
  QWindow *in_stack_ffffffffffffffb0;
  QFont *this_01;
  QFont *font_00;
  QGraphicsWidgetPrivate *this_02;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_02 = in_RDI;
  this_00 = d_func((QGraphicsWidget *)0xa4ce4e);
  QFont::resolveMask(in_RSI);
  setAttribute(in_stack_ffffffffffffffb0,(WidgetAttribute)((ulong)in_RDI >> 0x20),
               SUB81((ulong)in_RDI >> 0x18,0));
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  font_00 = (QFont *)&local_18;
  QGraphicsWidgetPrivate::naturalWidgetFont(this_02);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  this_01 = (QFont *)&local_28;
  QFont::resolve(this_01);
  QGraphicsWidgetPrivate::setFont_helper(this_00,font_00);
  QFont::~QFont(this_01);
  QFont::~QFont(font_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsWidget::setFont(const QFont &font)
{
    Q_D(QGraphicsWidget);
    setAttribute(Qt::WA_SetFont, font.resolveMask() != 0);

    QFont naturalFont = d->naturalWidgetFont();
    QFont resolvedFont = font.resolve(naturalFont);
    d->setFont_helper(resolvedFont);
}